

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_observer.hpp
# Opt level: O0

void __thiscall
afsm::test::test_fsm_observer::
enqueue_event<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::ready_for_query>
          (test_fsm_observer *this,
          state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          *param_1,ready_for_query *param_2)

{
  ansi_color val;
  ostream *poVar1;
  string local_68;
  string local_48;
  int local_24;
  ready_for_query *local_20;
  ready_for_query *param_2_local;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *param_1_local;
  test_fsm_observer *this_local;
  
  local_20 = param_2;
  param_2_local = (ready_for_query *)param_1;
  param_1_local =
       (state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
        *)this;
  val = psst::operator|(blue,dim);
  poVar1 = psst::operator<<((ostream *)&std::cerr,val);
  local_24 = (int)std::setw(0x11);
  poVar1 = std::operator<<(poVar1,(_Setw)local_24);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::left);
  psst::util::demangle<afsm::test::events::ready_for_query>();
  get_name_components(&local_48,&local_68,1);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = psst::operator<<(poVar1,clear);
  std::operator<<(poVar1,": Enqueue event\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void
    enqueue_event(FSM const&, Event const&) const noexcept
    {
        using ::psst::ansi_color;
        using ::psst::util::demangle;
        ::std::cerr
             << (ansi_color::blue | ansi_color::dim)
             << ::std::setw(event_name_width) << ::std::left
             << get_name_components(demangle<Event>(), 1)
             << ansi_color::clear
             << ": Enqueue event\n";
    }